

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this;
  bool bVar1;
  helper *phVar2;
  void *pvVar3;
  mapped_type *pmVar4;
  C local_578;
  B local_543;
  allocator<std::vector<A,_std::allocator<A>_>_> local_542;
  allocator<A> local_541;
  vector<A,_std::allocator<A>_> local_540;
  vector<std::vector<A,_std::allocator<A>_>,_std::allocator<std::vector<A,_std::allocator<A>_>_>_>
  local_528;
  allocator<A> local_509;
  vector<A,_std::allocator<A>_> local_508;
  undefined1 local_4f0 [8];
  string str;
  ostringstream oss;
  key_type local_358;
  ostringstream local_338 [8];
  ostringstream oss_1;
  int local_1bc;
  undefined1 local_1b8 [4];
  int i;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  map2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  map;
  value_type local_150;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_130;
  allocator<int> local_115;
  value_type_conflict1 local_114;
  vector<int,_std::allocator<int>_> local_110;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  undefined1 local_a8 [23];
  allocator<char> local_91;
  string local_90 [32];
  holder local_70;
  holder h;
  A local_54;
  undefined1 local_50 [4];
  A aa;
  struct_helper<A> a;
  char **argv_local;
  int argc_local;
  
  jsonip::detail::struct_helper<A>::struct_helper((struct_helper<A> *)local_50);
  phVar2 = jsonip::detail::get_helper<A>(&local_54);
  if (phVar2 == (helper *)0x0) {
    __assert_fail("detail::get_helper(aa)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/catedrasaes-umu[P]jsonip/test/test.cpp"
                  ,0x22,"int main(int, char **)");
  }
  jsonip::holder::holder<A>(&local_70,&local_54);
  phVar2 = jsonip::detail::get_helper<A>(&local_54);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_90,"a",&local_91);
  (*phVar2->_vptr_helper[7])(local_a8,phVar2,&local_70,local_90);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"{}",&local_c9);
  bVar1 = jsonip::parse<A>(&local_54,&local_c8);
  if (!bVar1) {
    __assert_fail("parse(aa, \"{}\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/catedrasaes-umu[P]jsonip/test/test.cpp"
                  ,0x26,"int main(int, char **)");
  }
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"{\"a\" : 120}",&local_f1);
  bVar1 = jsonip::parse<A>(&local_54,&local_f0);
  if (!bVar1) {
    __assert_fail("parse(aa, \"{\\\"a\\\" : 120}\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/catedrasaes-umu[P]jsonip/test/test.cpp"
                  ,0x27,"int main(int, char **)");
  }
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  pvVar3 = (void *)std::ostream::operator<<(&std::cout,&local_54);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  pvVar3 = (void *)std::ostream::operator<<(&std::cout,local_54.a);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  jsonip::write<A>((ostream *)&std::cout,&local_54,true);
  pvVar3 = (void *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  local_114 = 100;
  std::allocator<int>::allocator(&local_115);
  std::vector<int,_std::allocator<int>_>::vector(&local_110,100,&local_114,&local_115);
  jsonip::write<std::vector<int,std::allocator<int>>>((ostream *)&std::cout,&local_110,true);
  std::vector<int,_std::allocator<int>_>::~vector(&local_110);
  std::allocator<int>::~allocator(&local_115);
  pvVar3 = (void *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"asd",
             (allocator<char> *)((long)&map._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  this = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)((long)&map._M_t._M_impl.super__Rb_tree_header._M_node_count + 6);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_130,100,&local_150,this);
  jsonip::write<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((ostream *)&std::cout,&local_130,true);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_130);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&map._M_t._M_impl.super__Rb_tree_header._M_node_count + 6));
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&map._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  pvVar3 = (void *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
         *)&map2._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
         *)local_1b8);
  for (local_1bc = 0; local_1bc < 100; local_1bc = local_1bc + 1) {
    std::__cxx11::ostringstream::ostringstream(local_338);
    std::ostream::operator<<(local_338,local_1bc);
    std::__cxx11::ostringstream::str();
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                           *)&map2._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_358);
    *pmVar4 = (double)local_1bc * 3.3333333333333335;
    std::__cxx11::string::~string((string *)&local_358);
    std::__cxx11::ostringstream::~ostringstream(local_338);
  }
  jsonip::
  write<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>>
            ((ostream *)&std::cout,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
              *)&map2._M_t._M_impl.super__Rb_tree_header._M_node_count,true);
  pvVar3 = (void *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(str.field_2._M_local_buf + 8));
  jsonip::
  write<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>>
            ((ostream *)(str.field_2._M_local_buf + 8),
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
              *)&map2._M_t._M_impl.super__Rb_tree_header._M_node_count,true);
  std::__cxx11::ostringstream::str();
  jsonip::
  parse<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>>
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
              *)local_1b8,(string *)local_4f0);
  jsonip::
  write<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>>
            ((ostream *)&std::cout,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
              *)local_1b8,true);
  pvVar3 = (void *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  std::allocator<A>::allocator(&local_509);
  std::vector<A,_std::allocator<A>_>::vector(&local_508,0x14,&local_54,&local_509);
  jsonip::write<std::vector<A,std::allocator<A>>>((ostream *)&std::cout,&local_508,true);
  std::vector<A,_std::allocator<A>_>::~vector(&local_508);
  std::allocator<A>::~allocator(&local_509);
  pvVar3 = (void *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  std::allocator<A>::allocator(&local_541);
  std::vector<A,_std::allocator<A>_>::vector(&local_540,5,&local_54,&local_541);
  std::allocator<std::vector<A,_std::allocator<A>_>_>::allocator(&local_542);
  std::
  vector<std::vector<A,_std::allocator<A>_>,_std::allocator<std::vector<A,_std::allocator<A>_>_>_>::
  vector(&local_528,0x14,&local_540,&local_542);
  jsonip::
  write<std::vector<std::vector<A,std::allocator<A>>,std::allocator<std::vector<A,std::allocator<A>>>>>
            ((ostream *)&std::cout,&local_528,true);
  std::
  vector<std::vector<A,_std::allocator<A>_>,_std::allocator<std::vector<A,_std::allocator<A>_>_>_>::
  ~vector(&local_528);
  std::allocator<std::vector<A,_std::allocator<A>_>_>::~allocator(&local_542);
  std::vector<A,_std::allocator<A>_>::~vector(&local_540);
  std::allocator<A>::~allocator(&local_541);
  pvVar3 = (void *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  jsonip::write<B>((ostream *)&std::cout,&local_543,true);
  pvVar3 = (void *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  local_578.b.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_578.b.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_578.a.a = 0;
  local_578._4_4_ = 0;
  local_578.b.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_578.c = false;
  local_578._33_7_ = 0;
  C::C(&local_578);
  jsonip::write<C>((ostream *)&std::cout,&local_578,true);
  C::~C(&local_578);
  pvVar3 = (void *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_4f0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(str.field_2._M_local_buf + 8));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
          *)local_1b8);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
          *)&map2._M_t._M_impl.super__Rb_tree_header._M_node_count);
  jsonip::detail::struct_helper<A>::~struct_helper((struct_helper<A> *)local_50);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    typedef detail::struct_helper<A> type_t;
    detail::struct_helper<A> a;
    A aa;
    assert(detail::get_helper(aa));
    holder h(&aa);
    detail::get_helper(aa)->new_child(h, "a");

    assert(parse(aa, "{}"));
    assert(parse(aa, "{\"a\" : 120}"));

    std::cout << (void*)&aa.a << std::endl;
    std::cout << aa.a << std::endl;

    jsonip::write(std::cout, aa);
    std::cout << std::endl << std::endl;

    jsonip::write(std::cout, std::vector<int>(100, 100));
    std::cout << std::endl << std::endl;

    jsonip::write(std::cout, std::vector<std::string>(100, "asd"));
    std::cout << std::endl << std::endl;

    std::map<std::string, double> map, map2;
    for (int i = 0; i < 100; i++)
    {
        std::ostringstream oss;
        oss << i;
        map[oss.str()] = 10.0 / 3.0 * double(i);
    }

    jsonip::write(std::cout, map);
    std::cout << std::endl << std::endl;

    std::ostringstream oss;
    jsonip::write(oss, map);
    const std::string str = oss.str();
    jsonip::parse(map2, str);

    jsonip::write(std::cout, map2);
    std::cout << std::endl << std::endl;

    jsonip::write(std::cout, std::vector<A>(20, aa));
    std::cout << std::endl << std::endl;

    jsonip::write(std::cout,
                  std::vector<std::vector<A> >(20, std::vector<A>(5, aa)));
    std::cout << std::endl << std::endl;

    jsonip::write(std::cout, B());
    std::cout << std::endl << std::endl;

    jsonip::write(std::cout, C());
    std::cout << std::endl << std::endl;

    return 0;
}